

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O3

size_t __thiscall
Assimp::BlobIOStream::Write(BlobIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  size_t sVar1;
  size_t __n;
  ulong uVar2;
  
  __n = pSize * pCount;
  sVar1 = this->cursor;
  if (this->cur_size < sVar1 + __n) {
    Grow(this,sVar1 + __n);
    sVar1 = this->cursor;
  }
  memcpy(this->buffer + sVar1,pvBuffer,__n);
  uVar2 = __n + this->cursor;
  this->cursor = uVar2;
  if (uVar2 < this->file_size) {
    uVar2 = this->file_size;
  }
  this->file_size = uVar2;
  return pCount;
}

Assistant:

virtual size_t Write(const void* pvBuffer,
        size_t pSize,
        size_t pCount)
    {
        pSize *= pCount;
        if (cursor + pSize > cur_size) {
            Grow(cursor + pSize);
        }

        memcpy(buffer+cursor, pvBuffer, pSize);
        cursor += pSize;

        file_size = std::max(file_size,cursor);
        return pCount;
    }